

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareBoilerplateShader
          (GPUShaderFP64Test2 *this,GLchar *stage_specific_layout,GLchar *stage_specific_main_body,
          string *out_source_code)

{
  GLchar *__s;
  size_t local_68;
  size_t search_position;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string string;
  string *out_source_code_local;
  GLchar *stage_specific_main_body_local;
  GLchar *stage_specific_layout_local;
  GPUShaderFP64Test2 *this_local;
  
  __s = prepareBoilerplateShader::boilerplate_shader_template_code;
  string.field_2._8_8_ = out_source_code;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_68 = 0;
  Utils::replaceToken(prepareBoilerplateShader::layout_token,&local_68,stage_specific_layout,
                      (string *)local_48);
  Utils::replaceToken(prepareBoilerplateShader::body_token,&local_68,stage_specific_main_body,
                      (string *)local_48);
  std::__cxx11::string::operator=((string *)string.field_2._8_8_,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareBoilerplateShader(const glw::GLchar* stage_specific_layout,
												  const glw::GLchar* stage_specific_main_body,
												  std::string&		 out_source_code) const
{
	/* Shader template */
	static const glw::GLchar* boilerplate_shader_template_code = "#version 400 core\n"
																 "\n"
																 "precision highp float;\n"
																 "\n"
																 "STAGE_SPECIFIC_LAYOUT"
																 "void main()\n"
																 "{\n"
																 "STAGE_SPECIFIC_MAIN_BODY"
																 "}\n"
																 "\n";

	std::string string = boilerplate_shader_template_code;

	/* Tokens */
	static const glw::GLchar* body_token   = "STAGE_SPECIFIC_MAIN_BODY";
	static const glw::GLchar* layout_token = "STAGE_SPECIFIC_LAYOUT";

	size_t search_position = 0;

	/* Replace tokens */
	Utils::replaceToken(layout_token, search_position, stage_specific_layout, string);
	Utils::replaceToken(body_token, search_position, stage_specific_main_body, string);

	/* Store resuls */
	out_source_code = string;
}